

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::builtins::PastFunc::bindArgument
          (PastFunc *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,Args *param_4
          )

{
  socklen_t __len;
  int iVar1;
  undefined4 extraout_var;
  
  __len = 0x10020;
  if (argIndex != 2) {
    __len = (uint)(argIndex == 0) << 0x10;
  }
  iVar1 = Expression::bind((int)syntax,(sockaddr *)context,__len);
  return (Expression *)CONCAT44(extraout_var,iVar1);
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args&) const final {
        bitmask<ASTFlags> extraFlags = ASTFlags::None;
        if (argIndex == 0 || argIndex == 2)
            extraFlags = ASTFlags::AssertionExpr;

        if (argIndex == 2)
            extraFlags |= ASTFlags::NonProcedural;

        return Expression::bind(syntax, context, extraFlags);
    }